

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

char * event_mm_strdup_(char *str)

{
  _func_void_ptr_size_t *p_Var1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  int *piVar4;
  
  p_Var1 = mm_malloc_fn_;
  if (str == (char *)0x0) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
  }
  else {
    if (mm_malloc_fn_ == (_func_void_ptr_size_t *)0x0) {
      pcVar3 = strdup(str);
      return pcVar3;
    }
    sVar2 = strlen(str);
    if (sVar2 != 0xffffffffffffffff) {
      __dest = (*p_Var1)(sVar2 + 1);
      if (__dest != (void *)0x0) {
        pcVar3 = (char *)memcpy(__dest,str,sVar2 + 1);
        return pcVar3;
      }
    }
    piVar4 = __errno_location();
    *piVar4 = 0xc;
  }
  return (char *)0x0;
}

Assistant:

char *
event_mm_strdup_(const char *str)
{
	if (!str) {
		errno = EINVAL;
		return NULL;
	}

	if (mm_malloc_fn_) {
		size_t ln = strlen(str);
		void *p = NULL;
		if (ln == EV_SIZE_MAX)
			goto error;
		p = mm_malloc_fn_(ln+1);
		if (p)
			return memcpy(p, str, ln+1);
	} else
#ifdef _WIN32
		return _strdup(str);
#else
		return strdup(str);
#endif

error:
	errno = ENOMEM;
	return NULL;
}